

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmMakefile *this_00;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  char *pcVar6;
  undefined4 extraout_var;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer __rhs;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string langFlags;
  string launcher;
  string responseFlag;
  cmNinjaRule rule;
  __uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  string local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  char *local_2c8;
  long local_2c0;
  string local_2a8;
  RuleVariables local_288;
  undefined1 local_178 [64];
  string local_138 [32];
  string local_118 [96];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [40];
  string local_50;
  
  LanguageLinkerDeviceRule_abi_cxx11_(&local_50,this);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_178,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar4,(string *)local_178);
  if (!bVar2) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_288);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_288.CMTargetName = (psVar5->_M_dataplus)._M_p;
    TVar3 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    local_288.CMTargetType = cmState::GetTargetTypeName(TVar3);
    local_288.Language = "CUDA";
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"CMAKE_CUDA_RESPONSE_FILE_LINK_FLAG",
               (allocator<char> *)&local_2e8);
    psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_328);
    std::__cxx11::string::string((string *)&local_2c8,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_328);
    local_288.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    local_288.Objects = "$in";
    if ((useResponseFile) && (local_2c0 != 0)) {
      std::__cxx11::string::assign(local_b8);
      std::__cxx11::string::append((string *)&local_2c8);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign(local_98);
      std::__cxx11::string::append(local_98);
      local_288.LinkLibraries = "";
      local_288.Objects = local_2c8;
    }
    local_288.ObjectDir = "$OBJECT_DIR";
    local_288.Target = "$TARGET_FILE";
    local_288.SONameFlag = "$SONAME_FLAG";
    local_288.TargetSOName = "$SONAME";
    local_288.TargetPDB = "$TARGET_PDB";
    local_288.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_288.Flags = "$FLAGS";
    local_288.LinkFlags = "$LINK_FLAGS";
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_328._M_string_length = 0;
    local_288.Manifests = "$MANIFESTS";
    local_328.field_2._M_local_buf[0] = '\0';
    TVar3 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar3 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&local_328);
      local_288.LanguageCompileFlags = local_328._M_dataplus._M_p;
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"RULE_LAUNCH_LINK",(allocator<char> *)&local_2a8);
    pcVar6 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,target,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      std::__cxx11::string::assign((char *)&local_2e8);
      std::__cxx11::string::append((char *)&local_2e8);
    }
    local_348._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
         (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
           super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    local_348._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
    ComputeDeviceLinkCmd_abi_cxx11_(&local_340,this);
    for (__rhs = local_340.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __rhs != local_340.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      std::operator+(&local_308,&local_2e8,__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 local_348._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 outputConverter,__rhs,&local_288);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&local_340);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_308,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_340,&local_2a8,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)(local_178 + 0x20),(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::assign((char *)local_118);
    std::__cxx11::string::append(local_118);
    std::__cxx11::string::append((char *)local_118);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)local_118);
    std::__cxx11::string::append((char *)local_118);
    std::__cxx11::string::assign((char *)local_138);
    std::__cxx11::string::append(local_138);
    std::__cxx11::string::append((char *)local_138);
    GetVisibleTypeName(this);
    std::__cxx11::string::append((char *)local_138);
    std::__cxx11::string::append((char *)local_138);
    std::__cxx11::string::assign(local_78);
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_340);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&local_348);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_178);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRule(bool useResponseFile)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule());
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = "CUDA";

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (this->GetGeneratorTarget()->GetType() != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command = this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    rule.Comment = "Rule for linking ";
    rule.Comment += this->TargetLinkLanguage;
    rule.Comment += " ";
    rule.Comment += this->GetVisibleTypeName();
    rule.Comment += ".";
    rule.Description = "Linking ";
    rule.Description += this->TargetLinkLanguage;
    rule.Description += " ";
    rule.Description += this->GetVisibleTypeName();
    rule.Description += " $TARGET_FILE";
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}